

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatetimeedit.cpp
# Opt level: O0

QString * __thiscall QDateTimeEdit::displayFormat(QDateTimeEdit *this)

{
  bool bVar1;
  QDateTimeEditPrivate *pQVar2;
  QString *in_RDI;
  QDateTimeEditPrivate *d;
  QString *other;
  QString *this_00;
  
  this_00 = in_RDI;
  pQVar2 = d_func((QDateTimeEdit *)0x55a84e);
  bVar1 = QWidget::isRightToLeft((QWidget *)0x55a85d);
  if (bVar1) {
    other = &pQVar2->unreversedFormat;
  }
  else {
    other = (QString *)&pQVar2->field_0x438;
  }
  QString::QString(this_00,other);
  return in_RDI;
}

Assistant:

QString QDateTimeEdit::displayFormat() const
{
    Q_D(const QDateTimeEdit);
    return isRightToLeft() ? d->unreversedFormat : d->displayFormat;
}